

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

void __thiscall
rapidjson::
GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::SetSchemaSpecification
          (GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
           *this,ValueType *document)

{
  bool bVar1;
  SchemaDraft SVar2;
  OpenApiVersion OVar3;
  Specification SVar4;
  PointerType local_58;
  
  SVar2 = GetSchemaDraft(document);
  SVar4.oapi = kVersionNone;
  SVar4.draft = SVar2;
  OVar3 = GetOpenApiVersion(document);
  if (OVar3 == kVersionNone || SVar2 == kDraftNone) {
    if (SVar2 == kDraftNone) {
      if (OVar3 == kVersionNone) {
        SVar4.oapi = kVersionNone;
        SVar4.draft = (this->spec_).draft;
        OVar3 = (this->spec_).oapi;
      }
      else {
        SVar4.draft = kDraft2020_12;
        SVar4.oapi = kVersionNone;
        if (OVar3 != kVersion31) {
          SVar4 = (Specification)((ulong)(OVar3 == kVersion30) | 4);
        }
        this->spec_ = (Specification)((ulong)(uint)OVar3 << 0x20 | (ulong)SVar4);
      }
      goto LAB_001407ba;
    }
  }
  else {
    local_58.tokenCount_ = 0;
    local_58.parseErrorOffset_ = 0;
    local_58.nameBuffer_ = (Ch *)0x0;
    local_58.tokens_ = (Token *)0x0;
    local_58.allocator_ = (CrtAllocator *)0x0;
    local_58.ownAllocator_ = (CrtAllocator *)0x0;
    local_58.parseErrorCode_ = kPointerParseErrorNone;
    SchemaError(this,kSchemaErrorSpecIllegal,&local_58);
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::~GenericPointer(&local_58);
  }
  this->spec_ = SVar4;
  OVar3 = kVersionNone;
LAB_001407ba:
  if ((SVar4.draft == kDraftUnknown) || (OVar3 == kVersionUnknown)) {
    local_58.tokenCount_ = 0;
    local_58.parseErrorOffset_ = 0;
    local_58.nameBuffer_ = (Ch *)0x0;
    local_58.tokens_ = (Token *)0x0;
    local_58.allocator_ = (CrtAllocator *)0x0;
    local_58.ownAllocator_ = (CrtAllocator *)0x0;
    local_58.parseErrorCode_ = kPointerParseErrorNone;
    SchemaError(this,kSchemaErrorSpecUnknown,&local_58);
  }
  else {
    bVar1 = Specification::IsSupported(&this->spec_);
    if (bVar1) {
      return;
    }
    local_58.tokenCount_ = 0;
    local_58.parseErrorOffset_ = 0;
    local_58.nameBuffer_ = (Ch *)0x0;
    local_58.tokens_ = (Token *)0x0;
    local_58.allocator_ = (CrtAllocator *)0x0;
    local_58.ownAllocator_ = (CrtAllocator *)0x0;
    local_58.parseErrorCode_ = kPointerParseErrorNone;
    SchemaError(this,kSchemaErrorSpecUnsupported,&local_58);
  }
  GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  ::~GenericPointer(&local_58);
  return;
}

Assistant:

void SetSchemaSpecification(const ValueType& document) {
        // Look for '$schema', 'swagger' or 'openapi' keyword at document root
        SchemaDraft docDraft = GetSchemaDraft(document);
        OpenApiVersion docOapi = GetOpenApiVersion(document);
        // Error if both in document
        if (docDraft != kDraftNone && docOapi != kVersionNone)
          SchemaError(kSchemaErrorSpecIllegal, PointerType());
        // Use document draft or open api version if present or use spec from constructor
        if (docDraft != kDraftNone)
            spec_ = Specification(docDraft);
        else if (docOapi != kVersionNone)
            spec_ = Specification(docOapi);
        // Error if draft or version unknown
        if (spec_.draft == kDraftUnknown || spec_.oapi == kVersionUnknown)
          SchemaError(kSchemaErrorSpecUnknown, PointerType());
        else if (!spec_.IsSupported())
            SchemaError(kSchemaErrorSpecUnsupported, PointerType());
    }